

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locavailable.cpp
# Opt level: O1

Locale * icu_63::Locale::getAvailableLocales(int32_t *count)

{
  UBool UVar1;
  
  if (gInitOnceLocale != 2) {
    UVar1 = umtx_initImplPreInit((UInitOnce *)&gInitOnceLocale);
    if (UVar1 != '\0') {
      locale_available_init();
      umtx_initImplPostInit((UInitOnce *)&gInitOnceLocale);
    }
  }
  *count = availableLocaleListCount;
  return availableLocaleList;
}

Assistant:

const Locale* U_EXPORT2
Locale::getAvailableLocales(int32_t& count)
{
    umtx_initOnce(gInitOnceLocale, &locale_available_init);
    count = availableLocaleListCount;
    return availableLocaleList;
}